

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnLocalDecl(SharedValidator *this,Location *loc,Index count,Type type)

{
  pointer pLVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  LocalDecl local_8;
  
  pLVar1 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_start == pLVar1) {
    uVar2 = 0;
  }
  else {
    uVar2 = pLVar1[-1].end;
    if (CARRY4(uVar2,count)) {
      PrintError(this,loc,"local count must be < 0x10000000",
                 CONCAT44(in_register_0000000c,type.enum_),(ulong)(uVar2 + count));
      return (Result)Error;
    }
  }
  local_8.end = uVar2 + count;
  local_8.type.enum_ = type.enum_;
  std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>::
  emplace_back<wabt::SharedValidator::LocalDecl>(&this->locals_,&local_8);
  return (Result)Ok;
}

Assistant:

Result SharedValidator::OnLocalDecl(const Location& loc,
                                    Index count,
                                    Type type) {
  const auto max_locals = std::numeric_limits<Index>::max();
  if (count > max_locals - GetLocalCount()) {
    PrintError(loc, "local count must be < 0x10000000");
    return Result::Error;
  }
  locals_.push_back(LocalDecl{type, GetLocalCount() + count});
  return Result::Ok;
}